

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::run(Highs *this)

{
  HighsStatus HVar1;
  
  if ((this->options_).super_HighsOptionsStruct.use_warm_start == false) {
    clearSolver(this);
  }
  reportModelStats(this);
  if ((int)((ulong)((long)(this->multi_linear_objective_).
                          super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->multi_linear_objective_).
                         super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 6) != 0) {
    HVar1 = multiobjectiveSolve(this);
    return HVar1;
  }
  HVar1 = solve(this);
  return HVar1;
}

Assistant:

HighsStatus Highs::run() {
  if (!options_.use_warm_start) this->clearSolver();
  this->reportModelStats();
  HighsInt num_linear_objective = this->multi_linear_objective_.size();
  if (num_linear_objective == 0) return this->solve();
  return this->multiobjectiveSolve();
}